

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_log.hpp
# Opt level: O0

void __thiscall
pstore::
basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
::basic_rotating_log
          (basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
           *this,string *base_name,streamoff max_size,uint num_backups,
          mock_string_stream_traits *stream_traits,mock_file_system_traits *fs_traits)

{
  long *plVar1;
  long local_40;
  mock_file_system_traits *local_38;
  mock_file_system_traits *fs_traits_local;
  mock_string_stream_traits *stream_traits_local;
  streamoff sStack_20;
  uint num_backups_local;
  streamoff max_size_local;
  string *base_name_local;
  basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
  *this_local;
  
  local_38 = fs_traits;
  fs_traits_local = (mock_file_system_traits *)stream_traits;
  stream_traits_local._4_4_ = num_backups;
  sStack_20 = max_size;
  max_size_local = (streamoff)base_name;
  base_name_local = (string *)this;
  basic_logger::basic_logger(&this->super_basic_logger);
  (this->super_basic_logger).super_logger._vptr_logger =
       (_func_int **)&PTR__basic_rotating_log_003d3838;
  local_40 = 0;
  plVar1 = std::max<long>(&stack0xffffffffffffffe0,&local_40);
  this->max_size_ = *plVar1;
  std::__cxx11::string::string((string *)&this->base_name_,(string *)base_name);
  this->num_backups_ = stream_traits_local._4_4_;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->stream_);
  this->is_open_ = false;
  anon_unknown.dwarf_1ece36::mock_string_stream_traits::mock_string_stream_traits
            (&this->stream_traits_,(mock_string_stream_traits *)fs_traits_local);
  anon_unknown.dwarf_1ece36::mock_file_system_traits::mock_file_system_traits
            (&this->file_system_traits_,local_38);
  return;
}

Assistant:

basic_rotating_log<StreamTraits, FileSystemTraits>::basic_rotating_log (
        std::string base_name, std::streamoff const max_size, unsigned const num_backups,
        StreamTraits const & stream_traits, FileSystemTraits const & fs_traits)
            : max_size_ (std::max (max_size, std::streamoff{0}))
            , base_name_{std::move (base_name)}
            , num_backups_ (num_backups)
            , stream_ ()
            , stream_traits_ (stream_traits)
            , file_system_traits_ (fs_traits) {}